

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::HandleArguments
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *prop,ArgumentFlags flags)

{
  string *name;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  cmake *pcVar5;
  cmTarget *this_00;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint argIndex;
  allocator<char> local_51;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"called with incorrect number of arguments",
               (allocator<char> *)&argIndex);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  else {
    bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"can not be used on an ALIAS target.",
                 (allocator<char> *)&argIndex);
      cmCommand::SetError(&this->super_cmCommand,&local_50);
    }
    else {
      pcVar5 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      this_00 = cmGlobalGenerator::FindTarget
                          (pcVar5->GlobalGenerator,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,false);
      this->Target = this_00;
      if (this_00 == (cmTarget *)0x0) {
        this_00 = cmMakefile::FindTargetToUse
                            ((this->super_cmCommand).Makefile,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,false);
        this->Target = this_00;
        if (this_00 == (cmTarget *)0x0) {
          (*(this->super_cmCommand)._vptr_cmCommand[8])
                    (this,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
          return false;
        }
      }
      TVar4 = cmTarget::GetType(this_00);
      if (((((TVar4 == SHARED_LIBRARY) ||
            (TVar4 = cmTarget::GetType(this->Target), TVar4 == STATIC_LIBRARY)) ||
           (TVar4 = cmTarget::GetType(this->Target), TVar4 == OBJECT_LIBRARY)) ||
          ((TVar4 = cmTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY ||
           (TVar4 = cmTarget::GetType(this->Target), TVar4 == INTERFACE_LIBRARY)))) ||
         (TVar4 = cmTarget::GetType(this->Target), TVar4 == EXECUTABLE)) {
        argIndex = 1;
        iVar8 = 1;
        if (((flags & PROCESS_SYSTEM) == NO_FLAGS) ||
           (bVar1 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1,"SYSTEM"), !bVar1
           )) {
          bVar1 = false;
        }
        else {
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"called with incorrect number of arguments",&local_51);
            cmCommand::SetError(&this->super_cmCommand,&local_50);
            goto LAB_001bf65e;
          }
          argIndex = 2;
          bVar1 = true;
          iVar8 = 2;
        }
        if (((flags & PROCESS_BEFORE) == NO_FLAGS) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + (ulong)(uint)(iVar8 << 5)),
                                    "BEFORE"), !bVar2)) {
          bVar2 = false;
        }
        else {
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"called with incorrect number of arguments",&local_51);
            cmCommand::SetError(&this->super_cmCommand,&local_50);
            goto LAB_001bf65e;
          }
          argIndex = iVar8 + 1;
          bVar2 = true;
        }
        std::__cxx11::string::_M_assign((string *)&this->Property);
        do {
          uVar6 = (ulong)argIndex;
          uVar7 = (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar7 <= uVar6) {
            return uVar7 <= uVar6;
          }
          bVar3 = ProcessContentArgs(this,args,&argIndex,bVar2,bVar1);
        } while (bVar3);
        return uVar7 <= uVar6;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"called with non-compilable target type",
                 (allocator<char> *)&argIndex);
      cmCommand::SetError(&this->super_cmCommand,&local_50);
    }
  }
LAB_001bf65e:
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool cmTargetPropCommandBase::HandleArguments(
  std::vector<std::string> const& args, const std::string& prop,
  ArgumentFlags flags)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }
  // Lookup the target for which property-values are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    this->Target = this->Makefile->FindTargetToUse(args[0]);
  }
  if (!this->Target) {
    this->HandleMissingTarget(args[0]);
    return false;
  }
  if ((this->Target->GetType() != cmStateEnums::SHARED_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::MODULE_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
      (this->Target->GetType() != cmStateEnums::EXECUTABLE)) {
    this->SetError("called with non-compilable target type");
    return false;
  }

  bool system = false;
  unsigned int argIndex = 1;

  if ((flags & PROCESS_SYSTEM) && args[argIndex] == "SYSTEM") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    system = true;
    ++argIndex;
  }

  bool prepend = false;
  if ((flags & PROCESS_BEFORE) && args[argIndex] == "BEFORE") {
    if (args.size() < 3) {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
    prepend = true;
    ++argIndex;
  }

  this->Property = prop;

  while (argIndex < args.size()) {
    if (!this->ProcessContentArgs(args, argIndex, prepend, system)) {
      return false;
    }
  }
  return true;
}